

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ContinuousAssignSymbol::ContinuousAssignSymbol
          (ContinuousAssignSymbol *this,ExpressionSyntax *syntax)

{
  SourceLocation location;
  SyntaxNode *in_RSI;
  Symbol *in_RDI;
  Token in_stack_ffffffffffffffc8;
  string_view local_20;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc8.info,
             in_stack_ffffffffffffffc8._0_8_);
  slang::syntax::SyntaxNode::getFirstToken(in_RSI);
  location = parsing::Token::location((Token *)&stack0xffffffffffffffc8);
  Symbol::Symbol(in_RDI,ContinuousAssign,local_20,location);
  *(undefined8 *)(in_RDI + 1) = 0;
  std::optional<const_slang::ast::TimingControl_*>::optional
            ((optional<const_slang::ast::TimingControl_*> *)0x6367b0);
  Symbol::setSyntax(in_RDI,in_RSI);
  return;
}

Assistant:

ContinuousAssignSymbol::ContinuousAssignSymbol(const ExpressionSyntax& syntax) :
    Symbol(SymbolKind::ContinuousAssign, "", syntax.getFirstToken().location()) {

    setSyntax(syntax);
}